

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

Token __thiscall slang::parsing::Preprocessor::peek(Preprocessor *this)

{
  Token TVar1;
  
  if ((this->currentToken).info == (Info *)0x0) {
    TVar1 = nextProcessed(this);
    this->currentToken = TVar1;
  }
  return this->currentToken;
}

Assistant:

Token Preprocessor::peek() {
    if (!currentToken)
        currentToken = nextProcessed();
    return currentToken;
}